

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::length2(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *__return_storage_ptr__,
         SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this)

{
  long lVar1;
  int iVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  byte bVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_a8;
  
  bVar5 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&__return_storage_ptr__->m_backend,0,(type *)0x0);
  iVar2 = this->memused;
  if (iVar2 != 0) {
    v = this->m_elem;
    do {
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 0x1c;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems[6] = 0;
      local_a8.data._M_elems[7] = 0;
      local_a8.data._M_elems[8] = 0;
      local_a8.data._M_elems[9] = 0;
      local_a8.data._M_elems[10] = 0;
      local_a8.data._M_elems[0xb] = 0;
      local_a8.data._M_elems[0xc] = 0;
      local_a8.data._M_elems[0xd] = 0;
      local_a8.data._M_elems[0xe] = 0;
      local_a8.data._M_elems[0xf] = 0;
      local_a8.data._M_elems[0x10] = 0;
      local_a8.data._M_elems[0x11] = 0;
      local_a8.data._M_elems[0x12] = 0;
      local_a8.data._M_elems[0x13] = 0;
      local_a8.data._M_elems[0x14] = 0;
      local_a8.data._M_elems[0x15] = 0;
      local_a8.data._M_elems[0x16] = 0;
      local_a8.data._M_elems[0x17] = 0;
      local_a8.data._M_elems[0x18] = 0;
      local_a8.data._M_elems[0x19] = 0;
      local_a8.data._M_elems._104_5_ = 0;
      local_a8.data._M_elems[0x1b]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      if (v != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&local_a8) {
        pNVar3 = v;
        pcVar4 = &local_a8;
        for (lVar1 = 0x1c; lVar1 != 0; lVar1 = lVar1 + -1) {
          *(uint *)pcVar4 = (pNVar3->val).m_backend.data._M_elems[0];
          pNVar3 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)((long)pNVar3 + (ulong)bVar5 * -8 + 4);
          pcVar4 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar4 + ((ulong)bVar5 * -2 + 1) * 4);
        }
        local_a8.exp = (v->val).m_backend.exp;
        local_a8.neg = (v->val).m_backend.neg;
        local_a8.fpclass = (v->val).m_backend.fpclass;
        local_a8.prec_elem = (v->val).m_backend.prec_elem;
      }
      iVar2 = iVar2 + -1;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_a8,(cpp_dec_float<200U,_int,_void> *)v);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&__return_storage_ptr__->m_backend,&local_a8);
      v = v + 1;
    } while (iVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

R length2() const
   {
      R x = 0;
      int n = size();
      const Nonzero<R>* e = m_elem;

      while(n--)
      {
         x += e->val * e->val;
         e++;
      }

      return x;
   }